

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O2

Ivy_Man_t * Ivy_ManFrames(Ivy_Man_t *pMan,int nLatches,int nFrames,int fInit,Vec_Ptr_t **pvMapping)

{
  int iVar1;
  Ivy_Man_t *p;
  Ivy_Obj_t *pIVar2;
  Vec_Ptr_t *p_00;
  Ivy_Obj_t *p1;
  void *pvVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  Ivy_Obj_t *pIVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  int local_74;
  int local_6c;
  int local_60;
  
  if (pMan->nObjs[4] != 0) {
    __assert_fail("Ivy_ManLatchNum(pMan) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyMan.c"
                  ,0xb2,"Ivy_Man_t *Ivy_ManFrames(Ivy_Man_t *, int, int, int, Vec_Ptr_t **)");
  }
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyMan.c"
                  ,0xb3,"Ivy_Man_t *Ivy_ManFrames(Ivy_Man_t *, int, int, int, Vec_Ptr_t **)");
  }
  iVar13 = pMan->nObjs[1];
  local_74 = pMan->nObjs[2] - nLatches;
  iVar11 = pMan->vObjs->nSize;
  p = Ivy_ManStart();
  local_6c = 0;
  iVar6 = local_74;
  iVar4 = local_6c;
  if (0 < nLatches) {
    iVar4 = nLatches;
    local_6c = nLatches;
  }
  while (iVar4 != 0) {
    if (fInit == 0) {
      pIVar10 = Ivy_ObjCreatePi(p);
    }
    else {
      pIVar10 = (Ivy_Obj_t *)((ulong)p->pConst1 ^ 1);
    }
    pIVar2 = Ivy_ManPo(pMan,iVar6);
    pIVar2->pEquiv = pIVar10;
    iVar6 = iVar6 + 1;
    iVar4 = iVar4 + -1;
  }
  iVar13 = iVar13 - nLatches;
  lVar5 = (long)iVar11 + -1;
  lVar7 = nFrames * lVar5;
  iVar11 = (int)(lVar7 + 1);
  p_00 = Vec_PtrAlloc(iVar11);
  p_00->nSize = iVar11;
  iVar6 = 0;
  memset(p_00->pArray,0,lVar7 * 8 + 8);
  iVar11 = 0;
  if (0 < iVar13) {
    iVar11 = iVar13;
  }
  iVar4 = 0;
  if (0 < local_74) {
    iVar4 = local_74;
  }
  for (iVar1 = 0; iVar1 != nFrames; iVar1 = iVar1 + 1) {
    pMan->pConst1->pEquiv = p->pConst1;
    for (iVar8 = 0; iVar12 = iVar13, iVar9 = local_74, iVar14 = local_6c, iVar11 != iVar8;
        iVar8 = iVar8 + 1) {
      pIVar10 = Ivy_ObjCreatePi(p);
      pIVar2 = Ivy_ManPi(pMan,iVar8);
      pIVar2->pEquiv = pIVar10;
    }
    while (iVar14 != 0) {
      pIVar10 = Ivy_ManPo(pMan,iVar9);
      pIVar10 = pIVar10->pEquiv;
      pIVar2 = Ivy_ManPi(pMan,iVar12);
      pIVar2->pEquiv = pIVar10;
      iVar12 = iVar12 + 1;
      iVar9 = iVar9 + 1;
      iVar14 = iVar14 + -1;
    }
    for (iVar8 = 0; iVar8 < pMan->vObjs->nSize; iVar8 = iVar8 + 1) {
      pIVar10 = (Ivy_Obj_t *)Vec_PtrEntry(pMan->vObjs,iVar8);
      if ((pIVar10 != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pIVar10->field_0x8 & 0xf) - 7))
      {
        pIVar2 = Ivy_ObjChild0Equiv(pIVar10);
        p1 = Ivy_ObjChild1Equiv(pIVar10);
        pIVar2 = Ivy_And(p,pIVar2,p1);
        pIVar10->pEquiv = pIVar2;
      }
    }
    for (iVar8 = 0; iVar12 = local_74, iVar9 = local_6c, iVar4 != iVar8; iVar8 = iVar8 + 1) {
      pIVar10 = Ivy_ManPo(pMan,iVar8);
      pIVar10 = Ivy_ObjChild0Equiv(pIVar10);
      pIVar10 = Ivy_ObjCreatePo(p,pIVar10);
      pIVar2 = Ivy_ManPo(pMan,iVar8);
      pIVar2->pEquiv = pIVar10;
    }
    while (iVar9 != 0) {
      pIVar10 = Ivy_ManPo(pMan,iVar12);
      pIVar10 = Ivy_ObjChild0Equiv(pIVar10);
      pIVar2 = Ivy_ManPo(pMan,iVar12);
      pIVar2->pEquiv = pIVar10;
      iVar12 = iVar12 + 1;
      iVar9 = iVar9 + -1;
    }
    for (iVar8 = 0; iVar8 < pMan->vObjs->nSize; iVar8 = iVar8 + 1) {
      pvVar3 = Vec_PtrEntry(pMan->vObjs,iVar8);
      if (pvVar3 != (void *)0x0) {
        Vec_PtrWriteEntry(p_00,iVar6 + iVar8,*(void **)((long)pvVar3 + 0x48));
      }
    }
    local_60 = (int)lVar5;
    iVar6 = iVar6 + local_60;
  }
  if (fInit == 0) {
    while (bVar15 = local_6c != 0, local_6c = local_6c + -1, bVar15) {
      pIVar10 = Ivy_ManPo(pMan,local_74);
      Ivy_ObjCreatePo(p,pIVar10->pEquiv);
      local_74 = local_74 + 1;
    }
  }
  Ivy_ManCleanup(p);
  *pvMapping = p_00;
  iVar13 = Ivy_ManCheck(p);
  if (iVar13 == 0) {
    puts("Ivy_ManFrames(): The check has failed.");
  }
  return p;
}

Assistant:

Ivy_Man_t * Ivy_ManFrames( Ivy_Man_t * pMan, int nLatches, int nFrames, int fInit, Vec_Ptr_t ** pvMapping )
{
    Vec_Ptr_t * vMapping;
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i, f, nPis, nPos, nIdMax;
    assert( Ivy_ManLatchNum(pMan) == 0 );
    assert( nFrames > 0 );
    // prepare the mapping
    nPis = Ivy_ManPiNum(pMan) - nLatches;
    nPos = Ivy_ManPoNum(pMan) - nLatches;
    nIdMax = Ivy_ManObjIdMax(pMan);
    // create the new manager
    pNew = Ivy_ManStart();
    // set the starting values of latch inputs
    for ( i = 0; i < nLatches; i++ )
        Ivy_ManPo(pMan, nPos+i)->pEquiv = fInit? Ivy_Not(Ivy_ManConst1(pNew)) : Ivy_ObjCreatePi(pNew);
    // add timeframes
    vMapping = Vec_PtrStart( nIdMax * nFrames + 1 );
    for ( f = 0; f < nFrames; f++ )
    {
        // create PIs
        Ivy_ManConst1(pMan)->pEquiv = Ivy_ManConst1(pNew);
        for ( i = 0; i < nPis; i++ )
            Ivy_ManPi(pMan, i)->pEquiv = Ivy_ObjCreatePi(pNew);
        // transfer values to latch outputs
        for ( i = 0; i < nLatches; i++ )
            Ivy_ManPi(pMan, nPis+i)->pEquiv = Ivy_ManPo(pMan, nPos+i)->pEquiv;
        // perform strashing
        Ivy_ManForEachNode( pMan, pObj, i )
            pObj->pEquiv = Ivy_And( pNew, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
        // create POs
        for ( i = 0; i < nPos; i++ )
            Ivy_ManPo(pMan, i)->pEquiv = Ivy_ObjCreatePo( pNew, Ivy_ObjChild0Equiv(Ivy_ManPo(pMan, i)) );
        // set the results of latch inputs
        for ( i = 0; i < nLatches; i++ )
            Ivy_ManPo(pMan, nPos+i)->pEquiv = Ivy_ObjChild0Equiv(Ivy_ManPo(pMan, nPos+i));
        // save the pointers in this frame
        Ivy_ManForEachObj( pMan, pObj, i )
            Vec_PtrWriteEntry( vMapping, f * nIdMax + i, pObj->pEquiv );
    }
    // connect latches
    if ( !fInit )
        for ( i = 0; i < nLatches; i++ )
            Ivy_ObjCreatePo( pNew, Ivy_ManPo(pMan, nPos+i)->pEquiv );
    // remove dangling nodes
    Ivy_ManCleanup(pNew);
    *pvMapping = vMapping;
    // check the resulting network
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManFrames(): The check has failed.\n" );
    return pNew;
}